

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

void nng_ctx_recv(nng_ctx cid,nng_aio *aio)

{
  nng_err result;
  nni_ctx *local_20;
  nni_ctx *ctx;
  
  nni_aio_reset(aio);
  result = nni_ctx_find(&local_20,cid.id);
  if (result == NNG_OK) {
    nni_ctx_recv(local_20,aio);
    nni_ctx_rele(local_20);
  }
  else {
    nni_aio_finish_error(aio,result);
  }
  return;
}

Assistant:

void
nng_ctx_recv(nng_ctx cid, nng_aio *aio)
{
	int      rv;
	nni_ctx *ctx;

	nni_aio_reset(aio);
	if ((rv = nni_ctx_find(&ctx, cid.id)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_ctx_recv(ctx, aio);
	nni_ctx_rele(ctx);
}